

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O2

Var Js::JavascriptArray::FilterObjectHelper<unsigned_long>
              (RecyclableObject *obj,unsigned_long length,unsigned_long start,
              JavascriptArray *newArr,RecyclableObject *newObj,unsigned_long newStart,
              RecyclableObject *callBackFn,Var thisArg,ScriptContext *scriptContext)

{
  bool bVar1;
  ThreadContext *this;
  BOOL BVar2;
  uint uVar3;
  Var newValue;
  JavascriptMethod p_Var4;
  Var pvVar5;
  Var aItem;
  BigIndex index;
  BigIndex idxDest;
  undefined1 local_70 [8];
  JsReentLock jsReentLock;
  undefined1 local_40 [8];
  BigIndex i;
  
  local_70 = (undefined1  [8])scriptContext->threadContext;
  jsReentLock.m_threadContext = (ThreadContext *)0x0;
  jsReentLock.m_arrayObject = (Var)0x0;
  jsReentLock.m_arrayObject2._0_1_ = ((ThreadContext *)local_70)->noJsReentrancy;
  ((ThreadContext *)local_70)->noJsReentrancy = true;
  jsReentLock._24_8_ = obj;
  JsReentLock::setObjectForMutation((JsReentLock *)local_70,obj);
  BigIndex::BigIndex((BigIndex *)local_40,newStart);
  for (; start < length; start = start + 1) {
    *(undefined1 *)((long)local_70 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
    BVar2 = JavascriptOperators::HasItem((RecyclableObject *)jsReentLock._24_8_,start);
    JsReentLock::MutateArrayObject((JsReentLock *)local_70);
    *(bool *)((long)local_70 + 0x108) = true;
    if (BVar2 != 0) {
      *(undefined1 *)((long)local_70 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
      newValue = JavascriptOperators::GetItem
                           ((RecyclableObject *)jsReentLock._24_8_,start,scriptContext);
      this = scriptContext->threadContext;
      bVar1 = this->reentrancySafeOrHandled;
      this->reentrancySafeOrHandled = true;
      ThreadContext::CheckAndResetReentrancySafeOrHandled(this);
      ThreadContext::AssertJsReentrancy(scriptContext->threadContext);
      p_Var4 = RecyclableObject::GetEntryPoint(callBackFn);
      pvVar5 = JavascriptNumber::ToVar(start,scriptContext);
      aItem = (Var)0x0;
      pvVar5 = (*p_Var4)(callBackFn,(CallInfo)callBackFn,0x2000004,0,0,0,0,0x2000004,thisArg,
                         newValue,pvVar5,jsReentLock._24_8_);
      this->reentrancySafeOrHandled = bVar1;
      JsReentLock::MutateArrayObject((JsReentLock *)local_70);
      *(bool *)((long)local_70 + 0x108) = true;
      BVar2 = JavascriptConversion::ToBoolean(pvVar5,scriptContext);
      if (BVar2 != 0) {
        if (newArr == (JavascriptArray *)0x0) {
          *(undefined1 *)((long)local_70 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
          idxDest.bigIndex = (uint64)newValue;
          idxDest.index = i.index;
          idxDest._4_4_ = i._4_4_;
          uVar3 = SetArrayLikeObjects((JavascriptArray *)newObj,
                                      (RecyclableObject *)(ulong)(uint)local_40._0_4_,idxDest,aItem)
          ;
          index.bigIndex = (uint64)aItem;
          index.index = i.index;
          index._4_4_ = i._4_4_;
          ThrowErrorOnFailure((JavascriptArray *)(ulong)uVar3,(BOOL)scriptContext,
                              (ScriptContext *)(ulong)(uint)local_40._0_4_,index);
          JsReentLock::MutateArrayObject((JsReentLock *)local_70);
          *(bool *)((long)local_70 + 0x108) = true;
        }
        else {
          BigIndex::SetItem((BigIndex *)local_40,newArr,newValue);
        }
        if (local_40._0_4_ == 0xffffffff) {
          i._0_8_ = i._0_8_ + 1;
        }
        else {
          local_40._0_4_ = local_40._0_4_ + 1;
        }
      }
    }
  }
  if (newArr != (JavascriptArray *)0x0) {
    (*(newArr->super_ArrayObject).super_DynamicObject.super_RecyclableObject.super_FinalizableObject
      .super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x74])(newArr);
  }
  *(undefined1 *)((long)local_70 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
  return newObj;
}

Assistant:

Var JavascriptArray::FilterObjectHelper(RecyclableObject* obj, T length, T start, JavascriptArray* newArr, RecyclableObject* newObj, T newStart,
        RecyclableObject* callBackFn, Var thisArg, ScriptContext* scriptContext)
    {
        JS_REENTRANCY_LOCK(jsReentLock, scriptContext->GetThreadContext());
        SETOBJECT_FOR_MUTATION(jsReentLock, obj);

        Var element = nullptr;
        Var selected = nullptr;
        BigIndex i = BigIndex(newStart);

        for (T k = start; k < length; k++)
        {
            JS_REENTRANT(jsReentLock, BOOL hasItem = JavascriptOperators::HasItem(obj, k));
            if (hasItem)
            {
                JS_REENTRANT(jsReentLock,
                    element = JavascriptOperators::GetItem(obj, k, scriptContext);
                    BEGIN_SAFE_REENTRANT_CALL(scriptContext->GetThreadContext())
                    {
                        selected = CALL_ENTRYPOINT(scriptContext->GetThreadContext(),
                                callBackFn->GetEntryPoint(), callBackFn, CallInfo(CallFlags_Value, 4),
                                thisArg,
                                element,
                                JavascriptNumber::ToVar(k, scriptContext),
                                obj);
                    }
                    END_SAFE_REENTRANT_CALL
                );

                if (JavascriptConversion::ToBoolean(selected, scriptContext))
                {
                    if (newArr)
                    {
                        newArr->GenericDirectSetItemAt(i, element);
                    }
                    else
                    {
                        JS_REENTRANT(jsReentLock, ThrowErrorOnFailure(JavascriptArray::SetArrayLikeObjects(newObj, i, element), scriptContext, i));
                    }

                    ++i;
                }
            }
        }

#ifdef VALIDATE_ARRAY
        if (newArr)
        {
            newArr->ValidateArray();
        }
#endif

        return newObj;
    }